

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_json(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *this,NodeScalar *sc,NodeType flags)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  bool bVar5;
  error_flags eVar6;
  uint uVar7;
  csubstr cVar8;
  char msg [24];
  char *pcStack_58;
  size_t local_50;
  char *pcStack_30;
  size_t local_28;
  
  if (((sc->tag).len != 0) && ((sc->tag).str != (char *)0x0)) {
    builtin_strncpy(msg,"JSON does not have tags",0x18);
    eVar6 = get_error_flags();
    if ((eVar6 & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_tree->m_callbacks).m_error;
    cVar8 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_28 = cVar8.len;
    pcStack_30 = cVar8.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x5a4e) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x5a4e) << 0x40,8);
    LVar3.name.str = pcStack_30;
    LVar3.name.len = local_28;
    (*p_Var1)(msg,0x18,LVar3,(this->m_tree->m_callbacks).m_user_data);
  }
  if ((flags.type & (VALANCH|KEYANCH)) != NOTYPE) {
    builtin_strncpy(msg + 0x10,"ve ancho",8);
    builtin_strncpy(msg,"JSON does not ha",0x10);
    eVar6 = get_error_flags();
    if ((eVar6 & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_tree->m_callbacks).m_error;
    cVar8 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_50 = cVar8.len;
    pcStack_58 = cVar8.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x5a50) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x5a50) << 0x40,8);
    LVar4.name.str = pcStack_58;
    LVar4.name.len = local_50;
    (*p_Var1)(msg,0x1b,LVar4,(this->m_tree->m_callbacks).m_user_data);
  }
  uVar7 = ~(uint)flags.type;
  _write_scalar_json(this,sc->scalar,SUB41(((uint)flags.type & 2) >> 1,0),
                     (uVar7 & 0x1001) == 0 || (uVar7 & 0x2002) == 0);
  return;
}

Assistant:

void Emitter<Writer>::_write_json(NodeScalar const& C4_RESTRICT sc, NodeType flags)
{
    if(C4_UNLIKELY( ! sc.tag.empty()))
        _RYML_CB_ERR(m_tree->callbacks(), "JSON does not have tags");
    if(C4_UNLIKELY(flags.has_anchor()))
        _RYML_CB_ERR(m_tree->callbacks(), "JSON does not have anchors");
    _write_scalar_json(sc.scalar, flags.has_key(), flags.is_quoted());
}